

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

cmListFileBacktrace * __thiscall
cmListFileBacktrace::Push
          (cmListFileBacktrace *__return_storage_ptr__,cmListFileBacktrace *this,string *file)

{
  undefined1 local_68 [8];
  cmListFileContext lfc;
  string *file_local;
  cmListFileBacktrace *this_local;
  
  lfc.Line = (long)file;
  cmListFileContext::cmListFileContext((cmListFileContext *)local_68);
  std::__cxx11::string::operator=((string *)(lfc.Name.field_2._M_local_buf + 8),(string *)lfc.Line);
  cmListFileBacktrace(__return_storage_ptr__,&this->Bottom,this->Cur,(cmListFileContext *)local_68);
  cmListFileContext::~cmListFileContext((cmListFileContext *)local_68);
  return __return_storage_ptr__;
}

Assistant:

cmListFileBacktrace cmListFileBacktrace::Push(std::string const& file) const
{
  // We are entering a file-level scope but have not yet reached
  // any specific line or command invocation within it.  This context
  // is useful to print when it is at the top but otherwise can be
  // skipped during call stack printing.
  cmListFileContext lfc;
  lfc.FilePath = file;
  return cmListFileBacktrace(this->Bottom, this->Cur, lfc);
}